

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary-reader-ir.cc
# Opt level: O0

Result __thiscall
wabt::anon_unknown_15::BinaryReaderIR::OnSimdStoreLaneExpr
          (BinaryReaderIR *this,Opcode opcode,Index memidx,Address alignment_log2,Address offset,
          uint64_t value)

{
  int local_b4;
  Location local_b0;
  Var local_90;
  unique_ptr<wabt::SimdStoreLaneExpr,_std::default_delete<wabt::SimdStoreLaneExpr>_> local_48;
  unique_ptr<wabt::Expr,_std::default_delete<wabt::Expr>_> local_40;
  uint64_t local_38;
  uint64_t value_local;
  Address offset_local;
  Address alignment_log2_local;
  BinaryReaderIR *pBStack_18;
  Index memidx_local;
  BinaryReaderIR *this_local;
  Opcode opcode_local;
  
  local_38 = value;
  value_local = offset;
  offset_local = alignment_log2;
  alignment_log2_local._4_4_ = memidx;
  pBStack_18 = this;
  this_local._0_4_ = opcode.enum_;
  GetLocation(&local_b0,this);
  Var::Var(&local_90,memidx,&local_b0);
  local_b4 = 1 << ((byte)offset_local & 0x1f);
  std::
  make_unique<wabt::SimdStoreLaneExpr,wabt::Opcode&,wabt::Var,int,unsigned_long&,unsigned_long&>
            ((Opcode *)&local_48,(Var *)&this_local,(int *)&local_90,(unsigned_long *)&local_b4,
             &value_local);
  std::unique_ptr<wabt::Expr,std::default_delete<wabt::Expr>>::
  unique_ptr<wabt::SimdStoreLaneExpr,std::default_delete<wabt::SimdStoreLaneExpr>,void>
            ((unique_ptr<wabt::Expr,std::default_delete<wabt::Expr>> *)&local_40,&local_48);
  this_local._4_4_ = AppendExpr(this,&local_40);
  std::unique_ptr<wabt::Expr,_std::default_delete<wabt::Expr>_>::~unique_ptr(&local_40);
  std::unique_ptr<wabt::SimdStoreLaneExpr,_std::default_delete<wabt::SimdStoreLaneExpr>_>::
  ~unique_ptr(&local_48);
  Var::~Var(&local_90);
  return (Result)this_local._4_4_;
}

Assistant:

Result BinaryReaderIR::OnSimdStoreLaneExpr(Opcode opcode,
                                           Index memidx,
                                           Address alignment_log2,
                                           Address offset,
                                           uint64_t value) {
  return AppendExpr(std::make_unique<SimdStoreLaneExpr>(
      opcode, Var(memidx, GetLocation()), 1 << alignment_log2, offset, value));
}